

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v8::format_system_error(buffer<char> *out,int error_code,char *message)

{
  error_category *peVar1;
  char *value;
  error_code __ec;
  system_error local_40 [32];
  
  __ec._4_4_ = 0;
  __ec._M_value = error_code;
  peVar1 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar1;
  std::system_error::system_error(local_40,__ec,message);
  value = (char *)std::runtime_error::what();
  detail::write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
            ((back_insert_iterator<fmt::v8::detail::buffer<char>_>)out,value);
  std::system_error::~system_error(local_40);
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  const char* message) FMT_NOEXCEPT {
  FMT_TRY {
    auto ec = std::error_code(error_code, std::generic_category());
    write(std::back_inserter(out), std::system_error(ec, message).what());
    return;
  }